

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.h
# Opt level: O3

string * __thiscall
senjo::PerftCommandHandle::Usage_abi_cxx11_(string *__return_storage_ptr__,PerftCommandHandle *this)

{
  pointer pcVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  pcVar1 = (this->command)._M_dataplus._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar1,pcVar1 + (this->command)._M_string_length);
  std::__cxx11::string::append((char *)local_58);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_58,_TEST_FILE_abi_cxx11_);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_28 = *plVar4;
    lStack_20 = plVar3[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar4;
    local_38 = (long *)*plVar3;
  }
  local_30 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar5) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Usage() const {
    return (command + " [depth <x>] [count <x>] [skip <x>] [leafs <x>] "
                      "[epd] [file <x> (default=" + _TEST_FILE + ")]");
  }